

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

bool __thiscall slang::driver::Driver::parseCommandLine(Driver *this,string_view argList)

{
  pointer pbVar1;
  bool bVar2;
  byte bVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  pointer pbVar4;
  string_view fmt;
  format_args args;
  string_view text;
  string local_68;
  pointer local_48;
  size_type sStack_40;
  
  bVar2 = CommandLine::parse(&this->cmdLine,argList,(ParseOptions)0x0);
  if (bVar2) {
    bVar3 = this->anyFailedLoads ^ 1;
  }
  else {
    pbVar4 = (this->cmdLine).errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->cmdLine).errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 != pbVar1) {
      do {
        local_48 = (pbVar4->_M_dataplus)._M_p;
        sStack_40 = pbVar4->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x3;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v9::vformat_abi_cxx11_(&local_68,(v9 *)0x3d014a,fmt,args);
        text._M_str = local_68._M_dataplus._M_p;
        text._M_len = local_68._M_string_length;
        OS::printE(text);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
    }
    bVar3 = 0;
  }
  return (bool)bVar3;
}

Assistant:

[[nodiscard]] bool Driver::parseCommandLine(string_view argList) {
    if (!cmdLine.parse(argList)) {
        for (auto& err : cmdLine.getErrors())
            OS::printE(fmt::format("{}\n", err));
        return false;
    }
    return !anyFailedLoads;
}